

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  stbtt_uint16 sVar1;
  uint uVar2;
  stbtt_uint32 sVar3;
  int local_34;
  stbtt_uint32 loc;
  stbtt_int32 i;
  stbtt_uint32 tabledir;
  stbtt_int32 num_tables;
  char *tag_local;
  stbtt_uint32 fontstart_local;
  stbtt_uint8 *data_local;
  
  sVar1 = ttUSHORT(data + (ulong)fontstart + 4);
  local_34 = 0;
  while( true ) {
    if ((int)(uint)sVar1 <= local_34) {
      return 0;
    }
    uVar2 = fontstart + 0xc + local_34 * 0x10;
    if (((((uint)data[uVar2] == (int)*tag) && ((uint)data[(ulong)uVar2 + 1] == (int)tag[1])) &&
        ((uint)data[(ulong)uVar2 + 2] == (int)tag[2])) &&
       ((uint)data[(ulong)uVar2 + 3] == (int)tag[3])) break;
    local_34 = local_34 + 1;
  }
  sVar3 = ttULONG(data + (ulong)uVar2 + 8);
  return sVar3;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}